

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QRect __thiscall QAccessibleTable::rect(QAccessibleTable *this)

{
  int iVar1;
  int iVar2;
  QWidgetData *pQVar3;
  QAbstractItemView *pQVar4;
  QWidget *this_00;
  QPoint QVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = view(this);
  if ((((pQVar4->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
      0x8000) == 0) {
    uVar6 = 0xffffffffffffffff;
    QVar5.xp.m_i = 0;
    QVar5.yp.m_i = 0;
  }
  else {
    this_00 = (QWidget *)view(this);
    local_30.xp.m_i = 0;
    local_30.yp.m_i = 0;
    QVar5 = QWidget::mapToGlobal(this_00,&local_30);
    pQVar4 = view(this);
    pQVar3 = (pQVar4->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
    iVar1 = (pQVar3->crect).x2.m_i;
    iVar2 = (pQVar3->crect).x1.m_i;
    pQVar4 = view(this);
    pQVar3 = (pQVar4->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
    uVar6 = CONCAT44((QVar5.yp.m_i.m_i + (pQVar3->crect).y2.m_i) - (pQVar3->crect).y1.m_i,
                     (iVar1 + QVar5.xp.m_i.m_i) - iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar7.x2.m_i = (int)uVar6;
    QVar7.y2.m_i = (int)((ulong)uVar6 >> 0x20);
    QVar7.x1.m_i = QVar5.xp.m_i;
    QVar7.y1.m_i = QVar5.yp.m_i;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleTable::rect() const
{
    if (!view()->isVisible())
        return QRect();
    QPoint pos = view()->mapToGlobal(QPoint(0, 0));
    return QRect(pos.x(), pos.y(), view()->width(), view()->height());
}